

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O3

int alsa_allocate_recorder(ALLEGRO_AUDIO_RECORDER *r)

{
  ALLEGRO_AUDIO_DEPTH AVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  undefined8 uVar7;
  char *pcVar8;
  long *plVar9;
  size_t sVar10;
  ALLEGRO_THREAD *pAVar11;
  char *pcVar12;
  uint frequency;
  uint local_34;
  
  local_34 = r->frequency;
  uVar7 = al_get_system_config();
  pcVar8 = (char *)al_get_config_value(uVar7,"alsa","capture_device");
  if (pcVar8 == (char *)0x0) {
    pcVar12 = "default";
  }
  else {
    pcVar12 = "default";
    if (*pcVar8 != '\0') {
      pcVar12 = pcVar8;
    }
  }
  plVar9 = (long *)al_calloc_with_context
                             (1,0x10,0x32a,
                              "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                              ,"alsa_allocate_recorder");
  if (plVar9 == (long *)0x0) {
    return 1;
  }
  AVar1 = r->depth;
  if (((ulong)AVar1 < 0xb) && ((0x70fU >> (AVar1 & 0x1f) & 1) != 0)) {
    uVar2 = *(undefined4 *)(&DAT_001147e8 + (ulong)AVar1 * 4);
    iVar6 = snd_pcm_open(plVar9,pcVar12,1,0);
    if (iVar6 < 0) {
      cVar5 = _al_trace_prefix("alsa",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x341,"alsa_allocate_recorder");
      if (cVar5 == '\0') goto LAB_0011061f;
      uVar7 = snd_strerror(iVar6);
      pcVar8 = "snd_pcm_open(&data->capture_handle, device, SND_PCM_STREAM_CAPTURE, 0)";
    }
    else {
      iVar6 = snd_pcm_hw_params_malloc(plVar9 + 1);
      if (iVar6 < 0) {
        cVar5 = _al_trace_prefix("alsa",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x342,"alsa_allocate_recorder");
        if (cVar5 == '\0') goto LAB_0011061f;
        uVar7 = snd_strerror(iVar6);
        pcVar8 = "snd_pcm_hw_params_malloc(&data->hw_params)";
      }
      else {
        iVar6 = snd_pcm_hw_params_any(*plVar9,plVar9[1]);
        if (iVar6 < 0) {
          cVar5 = _al_trace_prefix("alsa",3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x343,"alsa_allocate_recorder");
          if (cVar5 == '\0') goto LAB_0011061f;
          uVar7 = snd_strerror(iVar6);
          pcVar8 = "snd_pcm_hw_params_any(data->capture_handle, data->hw_params)";
        }
        else {
          iVar6 = snd_pcm_hw_params_set_access(*plVar9,plVar9[1],3);
          if (iVar6 < 0) {
            cVar5 = _al_trace_prefix("alsa",3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                     ,0x344,"alsa_allocate_recorder");
            if (cVar5 == '\0') goto LAB_0011061f;
            uVar7 = snd_strerror(iVar6);
            pcVar8 = 
            "snd_pcm_hw_params_set_access(data->capture_handle, data->hw_params, SND_PCM_ACCESS_RW_INTERLEAVED)"
            ;
          }
          else {
            iVar6 = snd_pcm_hw_params_set_format(*plVar9,plVar9[1],uVar2);
            if (iVar6 < 0) {
              cVar5 = _al_trace_prefix("alsa",3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                       ,0x345,"alsa_allocate_recorder");
              if (cVar5 == '\0') goto LAB_0011061f;
              uVar7 = snd_strerror(iVar6);
              pcVar8 = "snd_pcm_hw_params_set_format(data->capture_handle, data->hw_params, format)"
              ;
            }
            else {
              iVar6 = snd_pcm_hw_params_set_rate_near(*plVar9,plVar9[1],&local_34,0);
              if (iVar6 < 0) {
                cVar5 = _al_trace_prefix("alsa",3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                         ,0x346,"alsa_allocate_recorder");
                if (cVar5 == '\0') goto LAB_0011061f;
                uVar7 = snd_strerror(iVar6);
                pcVar8 = 
                "snd_pcm_hw_params_set_rate_near(data->capture_handle, data->hw_params, &frequency, 0)"
                ;
              }
              else {
                if (local_34 != r->frequency) {
                  cVar5 = _al_trace_prefix("alsa",3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                           ,0x349,"alsa_allocate_recorder");
                  if (cVar5 != '\0') {
                    _al_trace_suffix("Unsupported rate! Requested %u, got %iu.\n",r->frequency,
                                     local_34);
                  }
                  goto LAB_0011061f;
                }
                lVar3 = *plVar9;
                lVar4 = plVar9[1];
                sVar10 = al_get_channel_count(r->chan_conf);
                iVar6 = snd_pcm_hw_params_set_channels(lVar3,lVar4,sVar10 & 0xffffffff);
                if (iVar6 < 0) {
                  cVar5 = _al_trace_prefix("alsa",3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                           ,0x34d,"alsa_allocate_recorder");
                  if (cVar5 == '\0') goto LAB_0011061f;
                  uVar7 = snd_strerror(iVar6);
                  pcVar8 = 
                  "snd_pcm_hw_params_set_channels(data->capture_handle, data->hw_params, al_get_channel_count(r->chan_conf))"
                  ;
                }
                else {
                  iVar6 = snd_pcm_hw_params(*plVar9,plVar9[1]);
                  if (iVar6 < 0) {
                    cVar5 = _al_trace_prefix("alsa",3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                             ,0x34e,"alsa_allocate_recorder");
                    if (cVar5 == '\0') goto LAB_0011061f;
                    uVar7 = snd_strerror(iVar6);
                    pcVar8 = "snd_pcm_hw_params(data->capture_handle, data->hw_params)";
                  }
                  else {
                    iVar6 = snd_pcm_prepare(*plVar9);
                    if (-1 < iVar6) {
                      r->extra = plVar9;
                      pAVar11 = (ALLEGRO_THREAD *)al_create_thread(alsa_update_recorder,r);
                      r->thread = pAVar11;
                      return 0;
                    }
                    cVar5 = _al_trace_prefix("alsa",3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                             ,0x350,"alsa_allocate_recorder");
                    if (cVar5 == '\0') goto LAB_0011061f;
                    uVar7 = snd_strerror(iVar6);
                    pcVar8 = "snd_pcm_prepare(data->capture_handle)";
                  }
                }
              }
            }
          }
        }
      }
    }
    _al_trace_suffix("%s: %s\n",uVar7,pcVar8);
  }
LAB_0011061f:
  if (plVar9[1] != 0) {
    snd_pcm_hw_params_free();
  }
  if (*plVar9 != 0) {
    snd_pcm_close();
  }
  al_free_with_context
            (plVar9,0x360,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
             ,"alsa_allocate_recorder");
  return 1;
}

Assistant:

static int alsa_allocate_recorder(ALLEGRO_AUDIO_RECORDER *r)
{
   ALSA_RECORDER_DATA *data;
   unsigned int frequency = r->frequency;
   snd_pcm_format_t format;
   const char *device = default_device;
   const char *config_device;
   config_device =
      al_get_config_value(al_get_system_config(), "alsa", "capture_device");
   if (config_device && config_device[0] != '\0')
      device = config_device;

   data = al_calloc(1, sizeof(*data));
   
   if (!data) {
      goto Error;
   }
   
   if (r->depth == ALLEGRO_AUDIO_DEPTH_INT8)
      format = SND_PCM_FORMAT_S8;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT8)
      format = SND_PCM_FORMAT_U8;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_INT16)
      format = SND_PCM_FORMAT_S16;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT16)
      format = SND_PCM_FORMAT_U16;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_INT24)
      format = SND_PCM_FORMAT_S24;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT24)
      format = SND_PCM_FORMAT_U24;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_FLOAT32)
      format = SND_PCM_FORMAT_FLOAT;
   else
      goto Error;
   
   ALSA_CHECK(snd_pcm_open(&data->capture_handle, device, SND_PCM_STREAM_CAPTURE, 0));
   ALSA_CHECK(snd_pcm_hw_params_malloc(&data->hw_params));
   ALSA_CHECK(snd_pcm_hw_params_any(data->capture_handle, data->hw_params));
   ALSA_CHECK(snd_pcm_hw_params_set_access(data->capture_handle, data->hw_params, SND_PCM_ACCESS_RW_INTERLEAVED));
   ALSA_CHECK(snd_pcm_hw_params_set_format(data->capture_handle, data->hw_params, format));
   ALSA_CHECK(snd_pcm_hw_params_set_rate_near(data->capture_handle, data->hw_params, &frequency, 0));
   
   if (frequency != r->frequency) {
      ALLEGRO_ERROR("Unsupported rate! Requested %u, got %iu.\n", r->frequency, frequency);
      goto Error;
   }
   
   ALSA_CHECK(snd_pcm_hw_params_set_channels(data->capture_handle, data->hw_params, al_get_channel_count(r->chan_conf)));
   ALSA_CHECK(snd_pcm_hw_params(data->capture_handle, data->hw_params));
   
   ALSA_CHECK(snd_pcm_prepare(data->capture_handle));
   
   r->extra = data;
   r->thread = al_create_thread(alsa_update_recorder, r);
   
   return 0;
   
Error:
   
   if (data) {
      if (data->hw_params) {
         snd_pcm_hw_params_free(data->hw_params);
      }
      if (data->capture_handle) {
         snd_pcm_close(data->capture_handle);
      }
      al_free(data);
   }
   
   return 1;
}